

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall
bloaty::RollupOutput::PrintRowToCSV
          (RollupOutput *this,RollupRow *row,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parent_labels,ostream *out,bool tabs,bool csvDiff)

{
  string_view separator;
  size_type sVar1;
  size_type sVar2;
  ostream *poVar3;
  ostream *in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  byte in_R8B;
  byte in_R9B;
  string sep;
  value_type *in_stack_fffffffffffffdf8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe00;
  allocator<char> *paVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *range;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  allocator<char> *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *__val;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  allocator<char> local_e0 [32];
  string local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80 [55];
  allocator<char> local_49;
  string local_48 [38];
  byte local_22;
  byte local_21;
  ostream *local_20;
  
  local_21 = in_R8B & 1;
  local_22 = in_R9B & 1;
  local_20 = in_RCX;
  while( true ) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDX);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDI);
    if (sVar2 <= sVar1) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  __val = local_80;
  std::__cxx11::to_string((long)__val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  std::__cxx11::string::~string(local_80);
  this_00 = &local_a0;
  std::__cxx11::to_string((long)__val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  std::__cxx11::string::~string((string *)&local_a0);
  if ((local_22 & 1) != 0) {
    in_stack_fffffffffffffe38 = local_c0;
    std::__cxx11::to_string((long)__val);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    std::__cxx11::string::~string(local_c0);
    in_stack_fffffffffffffe30 = local_e0;
    std::__cxx11::to_string((long)__val);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::to_string((long)__val);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::to_string((long)__val);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    std::__cxx11::string::~string(local_120);
  }
  if ((local_21 & 1) == 0) {
    range = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x558bd1;
  }
  else {
    range = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(anon_var_dwarf_22f230 + 0x11);
  }
  paVar4 = &local_141;
  pvVar5 = range;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  std::allocator<char>::~allocator(&local_141);
  std::__cxx11::string::operator_cast_to_basic_string_view(local_140);
  separator._M_str = (char *)pvVar5;
  separator._M_len = (size_t)paVar4;
  absl::StrJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (range,separator);
  poVar3 = std::operator<<(local_20,local_168);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string(local_140);
  return;
}

Assistant:

void RollupOutput::PrintRowToCSV(const RollupRow& row,
                                 std::vector<std::string> parent_labels,
                                 std::ostream* out, bool tabs, bool csvDiff) const {
  while (parent_labels.size() < source_names_.size()) {
    // If this label had no data at this level, append an empty string.
    parent_labels.push_back("");
  }

  parent_labels.push_back(std::to_string(row.size.vm));
  parent_labels.push_back(std::to_string(row.size.file));

  // If in diff where both old size are 0, get new size by adding diff size to
  // old size.
  if (csvDiff) {
    parent_labels.push_back(std::to_string(row.old_size.vm));
  	parent_labels.push_back(std::to_string(row.old_size.file));
    parent_labels.push_back(std::to_string(row.old_size.vm + (row.size.vm)));
    parent_labels.push_back(
        std::to_string(row.old_size.file + (row.size.file)));}

  std::string sep = tabs ? "\t" : ",";
  *out << absl::StrJoin(parent_labels, sep) << "\n";
}